

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool llvm::sys::path::has_root_directory(Twine *path,Style style)

{
  StringRef SVar1;
  size_t local_c8;
  StringRef p;
  SmallString<128U> path_storage;
  Style style_local;
  Twine *path_local;
  
  SmallString<128U>::SmallString((SmallString<128U> *)&p.Length);
  SVar1 = Twine::toStringRef(path,(SmallVectorImpl<char> *)&p.Length);
  SVar1 = root_directory(SVar1,style);
  local_c8 = SVar1.Length;
  SmallString<128U>::~SmallString((SmallString<128U> *)&p.Length);
  return (bool)((local_c8 == 0 ^ 0xffU) & 1);
}

Assistant:

bool has_root_directory(const Twine &path, Style style) {
  SmallString<128> path_storage;
  StringRef p = path.toStringRef(path_storage);

  return !root_directory(p, style).empty();
}